

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sys.cpp
# Opt level: O0

Url * __thiscall Vault::Sys::getUrl(Url *__return_storage_ptr__,Sys *this,Path *path)

{
  Client *pCVar1;
  allocator<char> local_41;
  string local_40 [32];
  Path *local_20;
  Path *path_local;
  Sys *this_local;
  
  pCVar1 = this->client_;
  local_20 = path;
  path_local = (Path *)this;
  this_local = (Sys *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,"/v1/sys/",&local_41);
  (*pCVar1->_vptr_Client[3])(__return_storage_ptr__,pCVar1,local_40,local_20);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  return __return_storage_ptr__;
}

Assistant:

Vault::Url Vault::Sys::getUrl(const Path &path) {
  return client_.getUrl("/v1/sys/", path);
}